

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

void __thiscall http::Page::Page(Page *this)

{
  Page *this_local;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__Page_00115c20;
  this->TagDepth = 0;
  this->StartTagOpen = false;
  osThread::osThread(&this->Thread);
  std::ostream::ostream(&this->m_ostream,&this->super_streambuf);
  std::istream::istream(&this->m_istream,&this->super_streambuf);
  this->m_put_back = 5;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_char_buffer);
  return;
}

Assistant:

http::Page::Page()
    : TagDepth(0)
    , StartTagOpen(false)
    , m_ostream(this)
    , m_istream(this)
    , m_put_back(5)
{
}